

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ParseMatrix(AsciiParser *this,matrix4d *result)

{
  bool bVar1;
  long lVar2;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> content;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = Expect(this,'(');
  if (!bVar1) {
    return false;
  }
  content.super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  content.super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  content.super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = SepBy1TupleType<double,4ul>(this,',',&content);
  if (bVar1) {
    if ((long)content.
              super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)content.
              super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x80) {
      bVar1 = Expect(this,')');
      if (bVar1) {
        for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 0x20) {
          *(undefined8 *)((long)result->m[0] + lVar2) =
               *(undefined8 *)
                ((long)(content.
                        super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar2);
          *(undefined8 *)((long)result->m[0] + lVar2 + 8) =
               *(undefined8 *)
                ((long)(content.
                        super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar2 + 8);
          *(undefined8 *)((long)result->m[0] + lVar2 + 0x10) =
               *(undefined8 *)
                ((long)(content.
                        super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar2 + 0x10);
          *(undefined8 *)((long)result->m[0] + lVar2 + 0x18) =
               *(undefined8 *)
                ((long)(content.
                        super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar2 + 0x18);
        }
        bVar1 = true;
        goto LAB_0031d444;
      }
    }
    else {
      ::std::__cxx11::to_string
                (&local_80,
                 (long)content.
                       super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)content.
                       super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      ::std::operator+(&local_60,"# of rows in matrix4d must be 4, but got ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_80);
      ::std::operator+(&local_40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_60,"\n");
      PushError(this,&local_40);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
  }
  bVar1 = false;
LAB_0031d444:
  ::std::_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
  ~_Vector_base(&content.
                 super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
               );
  return bVar1;
}

Assistant:

bool AsciiParser::ParseMatrix(value::matrix4d *result) {

  if (!Expect('(')) {
    return false;
  }

  std::vector<std::array<double, 4>> content;
  if (!SepBy1TupleType<double, 4>(',', &content)) {
    return false;
  }

  if (content.size() != 4) {
    PushError("# of rows in matrix4d must be 4, but got " +
              std::to_string(content.size()) + "\n");
    return false;
  }

  if (!Expect(')')) {
    return false;
  }

  for (size_t i = 0; i < 4; i++) {
    result->m[i][0] = content[i][0];
    result->m[i][1] = content[i][1];
    result->m[i][2] = content[i][2];
    result->m[i][3] = content[i][3];
  }

  return true;
}